

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.cpp
# Opt level: O1

bool anon_unknown.dwarf_7ff47::check_diff
               (uint64_t current_op,TraceRegisters *test,TraceRegisters *b,TraceRegisters *a,
               EmulateRegisters *regs,uint16_t P_before_op,char *str)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((((regs->_PC >> 0x10 == (uint)test->pc_bank) && (test->pc_address == (uint16_t)regs->_PC))
        && (test->X == regs->_X)) && ((test->Y == regs->_Y && (test->A == regs->_A)))) &&
      ((test->S == regs->_S && ((test->P == regs->_P && (test->DB == regs->_DB)))))) &&
     ((regs->_WRAM >> 0x10 == (uint)test->wram_bank && (test->wram_address == (uint16_t)regs->_WRAM)
      ))) {
    bVar1 = test->DP != regs->_DP;
  }
  if (bVar1 != false) {
    putchar(10);
    puts("ERROR!");
    puts("------");
    puts(
        "When re-emulating the trace a difference was found when comparing with the content of the .trace_helper file."
        );
    puts("This means that the snestistics emulator can\'t emulate this game yet.");
    putchar(10);
    puts(
        "You can still use snestistics but only for NMIs (frame number) below where this emulation bug occured."
        );
    puts("Be warned that incorrect details might be found in the assembly listing.");
    putchar(10);
    puts("Feel free to add an issue to github at https://github.com/breakin/snestistics/issues!");
    putchar(10);
    puts("DETAILS:");
    puts("--------");
    printf("  Found diff %s at op %d\n",str,current_op & 0xffffffff);
    printf("  P  %04X %04X %04X\n",(ulong)b->P,(ulong)a->P,(ulong)regs->_P);
    debug_P(b->P);
    debug_P(a->P);
    debug_P(P_before_op);
    debug_P(regs->_P);
    printf("  A    %04X %04X %04X\n",(ulong)b->A,(ulong)a->A,(ulong)regs->_A);
    printf("  X    %04X %04X %04X\n",(ulong)b->X,(ulong)a->X,(ulong)regs->_X);
    printf("  Y    %04X %04X %04X\n",(ulong)b->Y,(ulong)a->Y,(ulong)regs->_Y);
    printf("  S    %04X %04X %04X\n",(ulong)b->S,(ulong)a->S,(ulong)regs->_S);
    printf("  DB   %02X %02X %02X\n",(ulong)b->DB,(ulong)a->DB,(ulong)regs->_DB);
    printf("  DP   %04X %04X %04X\n",(ulong)b->DP,(ulong)a->DP,(ulong)regs->_DP);
    printf("  PC   %02X%04X %02X%04X %06X\n",(ulong)b->pc_bank,(ulong)b->pc_address,
           (ulong)a->pc_bank,(ulong)a->pc_address,(ulong)regs->_PC);
    printf("  WRAM %02X%04X %02X%04X %06X\n",(ulong)b->wram_bank,(ulong)b->wram_address,
           (ulong)a->wram_bank,(ulong)a->wram_address,(ulong)regs->_WRAM);
    putchar(10);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool check_diff(uint64_t current_op, const snestistics::TraceRegisters &test, const snestistics::TraceRegisters &b, const snestistics::TraceRegisters &a, const EmulateRegisters &regs, uint16_t P_before_op, const char * const str) {
		// b=before, a=after
		bool has_diff = 
			test.pc_bank != (regs._PC>>16) ||
			test.pc_address != (regs._PC & 0xFFFF) ||
			test.X  != regs._X  ||
			test.Y  != regs._Y  ||
			test.A  != regs._A  ||
			test.S  != regs._S  ||
			test.P  != regs._P  ||
			test.DB != regs._DB ||
			test.wram_bank != (regs._WRAM >> 16) ||
			test.wram_address != (regs._WRAM & 0xFFFF) ||
			test.DP != regs._DP;

		if (has_diff) {
			printf("\n");
			printf("ERROR!\n");
			printf("------\n");
			printf("When re-emulating the trace a difference was found when comparing with the content of the .trace_helper file.\n");
			printf("This means that the snestistics emulator can't emulate this game yet.\n");
			printf("\n");
			printf("You can still use snestistics but only for NMIs (frame number) below where this emulation bug occured.\n");
			printf("Be warned that incorrect details might be found in the assembly listing.\n");
			printf("\n");
			printf("Feel free to add an issue to github at https://github.com/breakin/snestistics/issues!\n");
			printf("\n");
			printf("DETAILS:\n");
			printf("--------\n");
			printf("  Found diff %s at op %d\n", str, (uint32_t)current_op); // TODO: How to print 64-bit cross platform?
			printf("  P  %04X %04X %04X\n", b.P, a.P, regs._P);
			debug_P(b.P);
			debug_P(a.P);
			debug_P(P_before_op);
			debug_P(regs._P);
			printf("  A    %04X %04X %04X\n", b.A, a.A, regs._A);
			printf("  X    %04X %04X %04X\n", b.X, a.X, regs._X);
			printf("  Y    %04X %04X %04X\n", b.Y, a.Y, regs._Y);
			printf("  S    %04X %04X %04X\n", b.S, a.S, regs._S);
			printf("  DB   %02X %02X %02X\n", b.DB, a.DB, regs._DB);
			printf("  DP   %04X %04X %04X\n", b.DP, a.DP, regs._DP);
			printf("  PC   %02X%04X %02X%04X %06X\n", b.pc_bank, b.pc_address, a.pc_bank, a.pc_address, regs._PC);
			printf("  WRAM %02X%04X %02X%04X %06X\n", b.wram_bank, b.wram_address, a.wram_bank, a.wram_address, regs._WRAM);
			printf("\n");
			return false;
		}
		return true;
	}